

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicatevisitor.cpp
# Opt level: O3

void __thiscall
PredicateVisitor::visit(PredicateVisitor *this,Expression *parent,VariableExpression *expression)

{
  bool bVar1;
  VariableExpression *local_10;
  
  local_10 = expression;
  if ((this->mPredicate).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*(this->mPredicate)._M_invoker)
                      ((_Any_data *)&this->mPredicate,(Expression **)&local_10);
    if (bVar1) {
      this->mHasResult = true;
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void PredicateVisitor::visit(Expression* parent, VariableExpression* expression) {
	if (mPredicate(expression)) {
		mHasResult = true;
	}
}